

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O1

void parse_iNes_1_0_header(uint8_t *rom_data)

{
  parsed_header.header_found = *(int *)rom_data == 0x1a53454e;
  parsed_header.PRG_ROM_chunks = rom_data[4];
  parsed_header.CHR_ROM_chunks = rom_data[5];
  parsed_header.flags6.data = rom_data[6];
  parsed_header.flags7.data = rom_data[7];
  parsed_header.CHR_RAM_chunks = rom_data[8];
  parsed_header.is_PAL = (_Bool)(rom_data[9] & 1);
  parsed_header.mapper = rom_data[6] >> 4 | rom_data[7] & 0xf0;
  return;
}

Assistant:

void parse_iNes_1_0_header(uint8_t* rom_data) {
    const uint32_t iNES_header_constant = 0x1A53454E;

    parsed_header.header_found      = *((uint32_t*)rom_data) == iNES_header_constant;
    parsed_header.PRG_ROM_chunks    = rom_data[4];
    parsed_header.CHR_ROM_chunks    = rom_data[5];
    parsed_header.flags6.data       = rom_data[6];
    parsed_header.flags7.data       = rom_data[7];
    parsed_header.CHR_RAM_chunks    = rom_data[8];
    parsed_header.is_PAL            = rom_data[9] & 0x1;
    parsed_header.mapper            = (parsed_header.flags7.fields.high_mapper_nibble << 4) | parsed_header.flags6.fields.low_mapper_nibble;
}